

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O2

Value * __thiscall
duckdb::KeyValueSecret::TryGetValue
          (Value *__return_storage_ptr__,KeyValueSecret *this,string *key,bool error_on_missing)

{
  const_iterator cVar1;
  InternalException *this_00;
  allocator local_b9;
  LogicalType local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  cVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_duckdb::CaseInsensitiveStringCompare,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
          ::find(&(this->secret_map)._M_t,key);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->secret_map)._M_t._M_impl.super__Rb_tree_header) {
    if (error_on_missing) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"Failed to fetch key \'%s\' from secret \'%s\' of type \'%s\'",
                 &local_b9);
      ::std::__cxx11::string::string((string *)&local_60,(string *)key);
      ::std::__cxx11::string::string((string *)&local_80,(string *)&(this->super_BaseSecret).name);
      ::std::__cxx11::string::string((string *)&local_a0,(string *)&(this->super_BaseSecret).type);
      InternalException::
      InternalException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (this_00,&local_40,&local_60,&local_80,&local_a0);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_b8,SQLNULL);
    Value::Value(__return_storage_ptr__,&local_b8);
    LogicalType::~LogicalType(&local_b8);
  }
  else {
    Value::Value(__return_storage_ptr__,(Value *)(cVar1._M_node + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

Value KeyValueSecret::TryGetValue(const string &key, bool error_on_missing) const {
	auto lookup = secret_map.find(key);
	if (lookup == secret_map.end()) {
		if (error_on_missing) {
			throw InternalException("Failed to fetch key '%s' from secret '%s' of type '%s'", key, name, type);
		}
		return Value();
	}

	return lookup->second;
}